

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_bang.c
# Opt level: O0

void bng_set(t_bng *x)

{
  int iVar1;
  double dVar2;
  int local_14;
  int sincelast;
  int holdtime;
  t_bng *x_local;
  
  local_14 = x->x_flashtime_hold;
  dVar2 = clock_gettimesince(x->x_lastflashtime);
  iVar1 = (int)dVar2;
  dVar2 = clock_getsystime();
  x->x_lastflashtime = dVar2;
  if (SBORROW4(iVar1,x->x_flashtime_hold * 2) != iVar1 + x->x_flashtime_hold * -2 < 0) {
    local_14 = iVar1 / 2;
  }
  if (local_14 < x->x_flashtime_break) {
    local_14 = x->x_flashtime_break;
  }
  x->x_flashed = 1;
  (*(x->x_gui).x_draw)(x,(x->x_gui).x_glist,0);
  clock_delay(x->x_clock_hld,(double)local_14);
  return;
}

Assistant:

static void bng_set(t_bng *x)
{
    int holdtime = x->x_flashtime_hold;
    int sincelast = clock_gettimesince(x->x_lastflashtime);
    x->x_lastflashtime = clock_getsystime();
    if (sincelast < x->x_flashtime_hold*2)
        holdtime = sincelast/2;
    if (holdtime < x->x_flashtime_break)
        holdtime = x->x_flashtime_break;
    x->x_flashed = 1;
    (*x->x_gui.x_draw)(x, x->x_gui.x_glist, IEM_GUI_DRAW_MODE_UPDATE);
    clock_delay(x->x_clock_hld, holdtime);
}